

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpg.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  long extraout_RAX;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char **ppcVar12;
  ifstream *input_stream;
  int local_608;
  int num_order;
  allocator local_5fd;
  int num_past_frame;
  char **local_5f8;
  string local_5f0;
  InputFormats local_5cc;
  ulong local_5c8;
  ulong local_5c0;
  InputSourceFromStream input_source;
  vector<double,_std::allocator<double>_> smoothed_static_parameters;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  window_coefficients;
  ulong local_558;
  double magic_number;
  InputSourcePreprocessing preprocessed_source;
  vector<double,_std::allocator<double>_> coefficients_3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  smoothed_static_parameters_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  variance_vectors;
  vector<double,_std::allocator<double>_> coefficients;
  bool local_338;
  bool local_330;
  ifstream ifs;
  uint auStack_260 [122];
  option long_options [2];
  
  num_order = 0x19;
  num_past_frame = 0x1e;
  window_coefficients.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  magic_number = 0.0;
  window_coefficients.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  window_coefficients.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  long_options[1].flag = (int *)0x0;
  long_options[1].val = 0;
  long_options[1]._28_4_ = 0;
  long_options[1].name = (char *)0x0;
  long_options[1].has_arg = 0;
  long_options[1]._12_4_ = 0;
  long_options[0].flag = (int *)0x0;
  long_options[0].val = 1000;
  long_options[0]._28_4_ = 0;
  long_options[0].name = "magic";
  long_options[0].has_arg = 1;
  long_options[0]._12_4_ = 0;
  local_558 = 0;
  local_5c0 = 0;
  local_5c8 = 0;
  local_5cc = kMeanAndVariance;
  local_608 = 0;
  local_5f8 = argv;
  do {
    iVar5 = ya_getopt_long_only(argc,local_5f8,"l:m:s:q:d:D:r:R:h",long_options,(int *)0x0);
    switch(iVar5) {
    case 100:
      if ((local_5c8 & 1) == 0) {
        coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&coefficients_3);
        bVar2 = sptk::ConvertStringToDouble((string *)&ifs,(double *)&input_source);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar2) {
          std::vector<double,_std::allocator<double>_>::push_back
                    (&coefficients,(value_type_conflict *)&input_source);
          for (; ya_optind < argc; ya_optind = ya_optind + 1) {
            std::__cxx11::string::string
                      ((string *)&ifs,local_5f8[ya_optind],(allocator *)&coefficients_3);
            bVar4 = sptk::ConvertStringToDouble((string *)&ifs,(double *)&input_source);
            std::__cxx11::string::~string((string *)&ifs);
            if (!bVar4) break;
            std::vector<double,_std::allocator<double>_>::push_back
                      (&coefficients,(value_type_conflict *)&input_source);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&window_coefficients,(value_type *)&coefficients);
          iVar5 = 4;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"The argument for the -d option must be numeric");
          std::__cxx11::string::string
                    ((string *)&coefficients_3,"mlpg",(allocator *)&preprocessed_source);
          sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
          std::__cxx11::string::~string((string *)&coefficients_3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
          iVar5 = 1;
          local_608 = iVar5;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&coefficients);
        if (bVar2) break;
        goto LAB_00103e1f;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"-d and -r options cannot be specified at the same time");
      std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&coefficients);
      sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
      goto LAB_001044e9;
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
switchD_00103787_caseD_65:
      anon_unknown.dwarf_4077::PrintUsage((ostream *)&std::cerr);
      goto LAB_00104503;
    case 0x68:
      local_608 = 0;
      anon_unknown.dwarf_4077::PrintUsage((ostream *)&std::cout);
      goto LAB_00104511;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&coefficients_3);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
      bVar2 = num_order < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar4 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&coefficients);
        sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
        goto LAB_001044e9;
      }
      num_order = num_order + -1;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&coefficients_3);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
      bVar4 = num_order < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar8 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
        std::operator<<(poVar8,"non-negative integer");
        std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&coefficients);
        sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
        goto LAB_001044e9;
      }
      break;
    case 0x71:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&coefficients_3);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&coefficients);
      if (bVar2) {
        bVar2 = sptk::IsInRange((InputFormats)
                                coefficients.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,0,2);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar2) {
          local_5cc = (InputFormats)
                      coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar8 = std::operator<<((ostream *)&ifs,"The argument for the -q option must be an integer ")
      ;
      poVar8 = std::operator<<(poVar8,"in the range of ");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0);
      poVar8 = std::operator<<(poVar8," to ");
      std::ostream::operator<<((ostream *)poVar8,2);
      std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&input_source);
      sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
      goto LAB_001044e9;
    case 0x72:
      if ((local_5c8 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"-r option cannot be specified multiple times");
        std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&coefficients);
        sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
        goto LAB_001044e9;
      }
      coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&coefficients_3);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&input_source);
      if (bVar2) {
        bVar2 = sptk::ComputeFirstOrderRegressionCoefficients
                          ((int)input_source.super_InputSourceInterface._vptr_InputSourceInterface,
                           &coefficients);
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar2) goto LAB_00103bb6;
        bVar2 = true;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&window_coefficients,(value_type *)&coefficients);
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
LAB_00103bb6:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -r option must be positive integer(s)"
                       );
        std::__cxx11::string::string
                  ((string *)&coefficients_3,"mlpg",(allocator *)&preprocessed_source);
        sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
        std::__cxx11::string::~string((string *)&coefficients_3);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        bVar2 = false;
        local_608 = 1;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&coefficients);
      if (!bVar2) goto LAB_00104511;
      lVar7 = (long)ya_optind;
      if (ya_optind < argc) {
        std::__cxx11::string::string((string *)&ifs,local_5f8[lVar7],(allocator *)&coefficients_3);
        bVar2 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&input_source);
        lVar7 = std::__cxx11::string::~string((string *)&ifs);
        if (bVar2) {
          coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar2 = sptk::ComputeSecondOrderRegressionCoefficients
                            ((int)input_source.super_InputSourceInterface._vptr_InputSourceInterface
                             ,&coefficients);
          if (bVar2) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back(&window_coefficients,(value_type *)&coefficients);
            ya_optind = ya_optind + 1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,
                            "The argument for the -r option must be positive integer(s)");
            std::__cxx11::string::string
                      ((string *)&coefficients_3,"mlpg",(allocator *)&preprocessed_source);
            sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
            std::__cxx11::string::~string((string *)&coefficients_3);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
            local_608 = 1;
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&coefficients);
          lVar7 = extraout_RAX;
          if (!bVar2) goto LAB_00104511;
        }
      }
      local_5c8 = CONCAT71((int7)((ulong)lVar7 >> 8),1);
      break;
    case 0x73:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&coefficients_3);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&num_past_frame);
      bVar4 = num_past_frame < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar8 = std::operator<<((ostream *)&ifs,"The argument for the -s option must be a ");
        std::operator<<(poVar8,"non-negative integer");
        std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&coefficients);
        sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
        goto LAB_001044e9;
      }
      break;
    default:
      if (iVar5 == 0x44) {
        if ((local_5c8 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"-D and -r options cannot be specified at the same time");
          std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&coefficients);
          sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
          goto LAB_001044e9;
        }
        std::ifstream::ifstream((string *)&ifs);
        std::ifstream::open((char *)&ifs,(_Ios_Openmode)ya_optarg);
        uVar1 = *(uint *)((long)auStack_260 + *(long *)(_ifs + -0x18));
        if ((uVar1 & 5) == 0) {
          coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          while (bVar2 = sptk::ReadStream<double>((double *)&coefficients,(istream *)&ifs), bVar2) {
            std::vector<double,_std::allocator<double>_>::push_back
                      (&coefficients_3,(value_type_conflict *)&coefficients);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&window_coefficients,
                      (value_type *)
                      &coefficients_3.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&coefficients_3.super__Vector_base<double,_std::allocator<double>_>);
          iVar5 = 4;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
          poVar8 = std::operator<<((ostream *)&coefficients_3,"Cannot open file ");
          std::operator<<(poVar8,ya_optarg);
          std::__cxx11::string::string((string *)&coefficients,"mlpg",(allocator *)&input_source);
          sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
          std::__cxx11::string::~string((string *)&coefficients);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
          iVar5 = 1;
          local_608 = iVar5;
        }
        std::ifstream::~ifstream((string *)&ifs);
        if ((uVar1 & 5) != 0) goto LAB_00103e1f;
      }
      else {
        if (iVar5 == 0x52) {
          std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&coefficients_3);
          bVar2 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&coefficients);
          if (bVar2) {
            bVar2 = sptk::IsInRange((InputFormats)
                                    coefficients.super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_start,0,1);
            std::__cxx11::string::~string((string *)&ifs);
            if (bVar2) {
              local_558 = (ulong)coefficients.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start & 0xffffffff;
              break;
            }
          }
          else {
            std::__cxx11::string::~string((string *)&ifs);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar8 = std::operator<<((ostream *)&ifs,
                                   "The argument for the -R option must be an integer ");
          poVar8 = std::operator<<(poVar8,"in the range of ");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0);
          poVar8 = std::operator<<(poVar8," to ");
          local_608 = 1;
          std::ostream::operator<<((ostream *)poVar8,1);
          std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&input_source);
          sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
          std::__cxx11::string::~string((string *)&coefficients_3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
          goto LAB_00104511;
        }
        if (iVar5 != 1000) {
          if (iVar5 != -1) goto switchD_00103787_caseD_65;
          goto LAB_00103e36;
        }
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&coefficients_3);
        bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&magic_number);
        uVar6 = std::__cxx11::string::~string((string *)&ifs);
        local_5c0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"The argument for the -magic option must be a number");
          std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&coefficients);
          sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
          goto LAB_001044e9;
        }
      }
    }
    iVar5 = 0;
LAB_00103e1f:
  } while (iVar5 == 0);
  if (iVar5 != 2) goto LAB_00104511;
LAB_00103e36:
  if (argc - ya_optind < 2) {
    if (argc == ya_optind) {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = local_5f8[ya_optind];
    }
    bVar2 = sptk::SetBinaryMode();
    if (bVar2) {
      input_stream = &ifs;
      std::ifstream::ifstream(input_stream);
      if ((pcVar11 == (char *)0x0) ||
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar11),
         (*(byte *)((long)auStack_260 + *(long *)(_ifs + -0x18)) & 5) == 0)) {
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          input_stream = (ifstream *)&std::cin;
        }
        ppcVar12 = (char **)((long)num_order + 1);
        sptk::InputSourceFromStream::InputSourceFromStream
                  (&input_source,false,
                   ((int)(((long)window_coefficients.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)window_coefficients.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18) + 1) *
                   (int)ppcVar12 * 2,(istream *)input_stream);
        preprocessed_source.super_InputSourceInterface._vptr_InputSourceInterface =
             (_func_int **)&PTR__InputSourceInterface_00118ae0;
        preprocessed_source.input_format_ = local_5cc;
        iVar5 = (**(code **)(CONCAT44(input_source.super_InputSourceInterface.
                                      _vptr_InputSourceInterface._4_4_,
                                      (int)input_source.super_InputSourceInterface.
                                           _vptr_InputSourceInterface) + 0x10))(&input_source);
        preprocessed_source.half_read_size_ = iVar5 / 2;
        preprocessed_source.is_valid_ = true;
        preprocessed_source.source_ = &input_source.super_InputSourceInterface;
        cVar3 = (**(code **)(CONCAT44(input_source.super_InputSourceInterface.
                                      _vptr_InputSourceInterface._4_4_,
                                      (int)input_source.super_InputSourceInterface.
                                           _vptr_InputSourceInterface) + 0x18))(&input_source);
        if (cVar3 == '\0') {
          preprocessed_source.is_valid_ = false;
        }
        if ((int)local_558 == 1) {
          sptk::NonrecursiveMaximumLikelihoodParameterGeneration::
          NonrecursiveMaximumLikelihoodParameterGeneration
                    ((NonrecursiveMaximumLikelihoodParameterGeneration *)&coefficients,num_order,
                     &window_coefficients,(bool)((byte)local_5c0 & 1),magic_number);
          if (local_330 == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
            poVar8 = std::operator<<((ostream *)&coefficients_3,"Failed to initialize ");
            std::operator<<(poVar8,"NonrecursiveMaximumLikelihoodParameterGeneration");
            std::__cxx11::string::string
                      ((string *)&local_5f0,"mlpg",(allocator *)&smoothed_static_parameters);
            sptk::PrintErrorMessage(&local_5f0,(ostringstream *)&coefficients_3);
            std::__cxx11::string::~string((string *)&local_5f0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
            local_608 = 1;
            bVar2 = false;
          }
          else {
            smoothed_static_parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            smoothed_static_parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            smoothed_static_parameters.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            variance_vectors.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            variance_vectors.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            variance_vectors.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_5f8 = ppcVar12;
            while (bVar2 = sptk::InputSourceFromStream::Get(&input_source,&coefficients_3), bVar2) {
              std::vector<double,std::allocator<double>>::
              vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                        ((vector<double,std::allocator<double>> *)&local_5f0,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )(coefficients_3.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start + input_source.read_size_ / 2),
                         (allocator_type *)&smoothed_static_parameters_1);
              std::
              vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              ::emplace_back<std::vector<double,std::allocator<double>>>
                        ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                          *)&smoothed_static_parameters,
                         (vector<double,_std::allocator<double>_> *)&local_5f0);
              std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                        ((_Vector_base<double,_std::allocator<double>_> *)&local_5f0);
              std::vector<double,std::allocator<double>>::
              vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                        ((vector<double,std::allocator<double>> *)&local_5f0,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )(coefficients_3.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start + input_source.read_size_ / 2),
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_finish,
                         (allocator_type *)&smoothed_static_parameters_1);
              std::
              vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              ::emplace_back<std::vector<double,std::allocator<double>>>
                        ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                          *)&variance_vectors,(vector<double,_std::allocator<double>_> *)&local_5f0)
              ;
              std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                        ((_Vector_base<double,_std::allocator<double>_> *)&local_5f0);
            }
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&coefficients_3.super__Vector_base<double,_std::allocator<double>_>);
            smoothed_static_parameters_1.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            smoothed_static_parameters_1.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            smoothed_static_parameters_1.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar2 = sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
                              ((NonrecursiveMaximumLikelihoodParameterGeneration *)&coefficients,
                               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&smoothed_static_parameters,&variance_vectors,
                               &smoothed_static_parameters_1);
            ppcVar12 = local_5f8;
            if (bVar2) {
              uVar9 = ((long)smoothed_static_parameters_1.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)smoothed_static_parameters_1.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18;
              uVar10 = uVar9 & 0xffffffff;
              if ((int)uVar9 < 1) {
                uVar10 = 0;
              }
              uVar9 = 0;
              do {
                if (uVar10 * 0x18 + 0x18 == uVar9 + 0x18) {
                  bVar2 = true;
                  goto LAB_0010499b;
                }
                bVar2 = sptk::WriteStream<double>
                                  (0,(int)ppcVar12,
                                   (vector<double,_std::allocator<double>_> *)
                                   ((long)&((smoothed_static_parameters_1.
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_start + uVar9),
                                   (ostream *)&std::cout,(int *)0x0);
                uVar9 = uVar9 + 0x18;
              } while (bVar2);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
              std::operator<<((ostream *)&coefficients_3,"Failed to write static parameters");
              std::__cxx11::string::string((string *)&local_5f0,"mlpg",&local_5fd);
              sptk::PrintErrorMessage(&local_5f0,(ostringstream *)&coefficients_3);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
              std::operator<<((ostream *)&coefficients_3,"Failed to perform MLPG");
              std::__cxx11::string::string((string *)&local_5f0,"mlpg",&local_5fd);
              sptk::PrintErrorMessage(&local_5f0,(ostringstream *)&coefficients_3);
            }
            std::__cxx11::string::~string((string *)&local_5f0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
            local_608 = 1;
            bVar2 = false;
LAB_0010499b:
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&smoothed_static_parameters_1);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&variance_vectors);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&smoothed_static_parameters);
          }
          sptk::NonrecursiveMaximumLikelihoodParameterGeneration::
          ~NonrecursiveMaximumLikelihoodParameterGeneration
                    ((NonrecursiveMaximumLikelihoodParameterGeneration *)&coefficients);
joined_r0x001049ce:
          if (!bVar2) goto LAB_001049d3;
        }
        else if ((int)local_558 == 0) {
          if ((local_5c0 & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
            std::operator<<((ostream *)&coefficients_3,
                            "Magic number is not supported on recursive mode");
            std::__cxx11::string::string((string *)&coefficients,"mlpg",(allocator *)&local_5f0);
            sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
            goto LAB_001040f5;
          }
          sptk::RecursiveMaximumLikelihoodParameterGeneration::
          RecursiveMaximumLikelihoodParameterGeneration
                    ((RecursiveMaximumLikelihoodParameterGeneration *)&coefficients,num_order,
                     num_past_frame,&window_coefficients,
                     &preprocessed_source.super_InputSourceInterface);
          if (local_338 == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
            std::operator<<((ostream *)&coefficients_3,
                            "Failed to initialize RecursiveMaximumLikelihoodParameterGeneration");
            std::__cxx11::string::string
                      ((string *)&local_5f0,"mlpg",(allocator *)&smoothed_static_parameters);
            sptk::PrintErrorMessage(&local_5f0,(ostringstream *)&coefficients_3);
            std::__cxx11::string::~string((string *)&local_5f0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
            local_608 = 1;
            bVar2 = false;
          }
          else {
            std::vector<double,_std::allocator<double>_>::vector
                      (&smoothed_static_parameters,(size_type)ppcVar12,
                       (allocator_type *)&coefficients_3);
            do {
              bVar2 = sptk::RecursiveMaximumLikelihoodParameterGeneration::Get
                                ((RecursiveMaximumLikelihoodParameterGeneration *)&coefficients,
                                 &smoothed_static_parameters);
              if (!bVar2) goto LAB_00104730;
              bVar4 = sptk::WriteStream<double>
                                (0,(int)ppcVar12,&smoothed_static_parameters,(ostream *)&std::cout,
                                 (int *)0x0);
            } while (bVar4);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
            std::operator<<((ostream *)&coefficients_3,"Failed to write static parameters");
            std::__cxx11::string::string((string *)&local_5f0,"mlpg",(allocator *)&variance_vectors)
            ;
            sptk::PrintErrorMessage(&local_5f0,(ostringstream *)&coefficients_3);
            std::__cxx11::string::~string((string *)&local_5f0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
            local_608 = 1;
LAB_00104730:
            bVar2 = !bVar2;
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&smoothed_static_parameters.
                        super__Vector_base<double,_std::allocator<double>_>);
          }
          sptk::RecursiveMaximumLikelihoodParameterGeneration::
          ~RecursiveMaximumLikelihoodParameterGeneration
                    ((RecursiveMaximumLikelihoodParameterGeneration *)&coefficients);
          goto joined_r0x001049ce;
        }
        local_608 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
        poVar8 = std::operator<<((ostream *)&coefficients_3,"Cannot open file ");
        std::operator<<(poVar8,pcVar11);
        std::__cxx11::string::string((string *)&coefficients,"mlpg",(allocator *)&input_source);
        sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
LAB_001040f5:
        std::__cxx11::string::~string((string *)&coefficients);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
        local_608 = 1;
      }
LAB_001049d3:
      std::ifstream::~ifstream(&ifs);
      goto LAB_00104511;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&coefficients);
    sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&coefficients_3,"mlpg",(allocator *)&coefficients);
    sptk::PrintErrorMessage((string *)&coefficients_3,(ostringstream *)&ifs);
  }
LAB_001044e9:
  std::__cxx11::string::~string((string *)&coefficients_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
LAB_00104503:
  local_608 = 1;
LAB_00104511:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&window_coefficients);
  return local_608;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int num_past_frame(kDefaultNumPastFrame);
  InputFormats input_format(kDefaultInputFormat);
  std::vector<std::vector<double> > window_coefficients;
  bool is_regression_specified(false);
  double magic_number(0.0);
  bool is_magic_number_specified(false);
  Modes mode(kDefaultMode);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:s:q:d:D:r:R:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &num_past_frame) ||
            num_past_frame < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'd': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-d and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        std::vector<double> coefficients;
        double coefficient;
        if (!sptk::ConvertStringToDouble(optarg, &coefficient)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be numeric";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        coefficients.push_back(coefficient);
        while (optind < argc &&
               sptk::ConvertStringToDouble(argv[optind], &coefficient)) {
          coefficients.push_back(coefficient);
          ++optind;
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'D': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-D and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        std::ifstream ifs;
        ifs.open(optarg, std::ios::in | std::ios::binary);
        if (ifs.fail()) {
          std::ostringstream error_message;
          error_message << "Cannot open file " << optarg;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        std::vector<double> coefficients;
        double coefficient;
        while (sptk::ReadStream(&coefficient, &ifs)) {
          coefficients.push_back(coefficient);
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'r': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message << "-r option cannot be specified multiple times";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }

        int n;
        // Set first order coefficients.
        {
          std::vector<double> coefficients;
          if (!sptk::ConvertStringToInteger(optarg, &n) ||
              !sptk::ComputeFirstOrderRegressionCoefficients(n,
                                                             &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("mlpg", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
        }

        // Set second order coefficients.
        if (optind < argc && sptk::ConvertStringToInteger(argv[optind], &n)) {
          std::vector<double> coefficients;
          if (!sptk::ComputeSecondOrderRegressionCoefficients(n,
                                                              &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("mlpg", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
          ++optind;
        }
        is_regression_specified = true;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'R': {
        const int min(0);
        const int max(static_cast<int>(kNumModes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -R option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mlpg", error_message);
          return 1;
        }
        mode = static_cast<Modes>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mlpg", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mlpg", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int static_size(num_order + 1);
  const int read_size(2 * static_size *
                      static_cast<int>(window_coefficients.size() + 1));
  sptk::InputSourceFromStream input_source(false, read_size, &input_stream);
  InputSourcePreprocessing preprocessed_source(input_format, &input_source);

  if (kRecursive == mode) {
    if (is_magic_number_specified) {
      std::ostringstream error_message;
      error_message << "Magic number is not supported on recursive mode";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    sptk::RecursiveMaximumLikelihoodParameterGeneration generation(
        num_order, num_past_frame, window_coefficients, &preprocessed_source);
    if (!generation.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize "
                       "RecursiveMaximumLikelihoodParameterGeneration";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    std::vector<double> smoothed_static_parameters(static_size);
    while (generation.Get(&smoothed_static_parameters)) {
      if (!sptk::WriteStream(0, static_size, smoothed_static_parameters,
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write static parameters";
        sptk::PrintErrorMessage("mlpg", error_message);
        return 1;
      }
    }
  } else if (kNonrecursive == mode) {
    sptk::NonrecursiveMaximumLikelihoodParameterGeneration generation(
        num_order, window_coefficients, is_magic_number_specified,
        magic_number);
    if (!generation.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize "
                    << "NonrecursiveMaximumLikelihoodParameterGeneration";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    std::vector<std::vector<double> > mean_vectors;
    std::vector<std::vector<double> > variance_vectors;
    {
      const int size(input_source.GetSize() / 2);
      std::vector<double> tmp;
      while (input_source.Get(&tmp)) {
        mean_vectors.push_back(
            std::vector<double>(tmp.begin(), tmp.begin() + size));
        variance_vectors.push_back(
            std::vector<double>(tmp.begin() + size, tmp.end()));
      }
    }

    std::vector<std::vector<double> > smoothed_static_parameters;
    if (!generation.Run(mean_vectors, variance_vectors,
                        &smoothed_static_parameters)) {
      std::ostringstream error_message;
      error_message << "Failed to perform MLPG";
      sptk::PrintErrorMessage("mlpg", error_message);
      return 1;
    }

    const int sequence_length(
        static_cast<int>(smoothed_static_parameters.size()));
    for (int t(0); t < sequence_length; ++t) {
      if (!sptk::WriteStream(0, static_size, smoothed_static_parameters[t],
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write static parameters";
        sptk::PrintErrorMessage("mlpg", error_message);
        return 1;
      }
    }
  }

  return 0;
}